

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  int64_t iVar2;
  void *pvVar3;
  int64_t step;
  iso9660 *iso9660;
  ssize_t bytes_read;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  pvVar1 = a->format->data;
  bytes_read = (ssize_t)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(long *)((long)pvVar1 + 0xe0) != 0) {
    __archive_read_consume(a,*(int64_t *)((long)pvVar1 + 0xe0));
    *(undefined8 *)((long)pvVar1 + 0xe0) = 0;
  }
  if (*(long *)((long)pvVar1 + 0xd8) < 1) {
    if (*(long *)((long)pvVar1 + 0x1e0) != 0) {
      *(undefined8 *)((long)pvVar1 + 0x1e0) =
           *(undefined8 *)(*(long *)((long)pvVar1 + 0x1e0) + 0x10);
    }
    if (*(long *)((long)pvVar1 + 0x1e0) == 0) {
      *size_local = 0;
      *offset_local = 0;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0xd0);
      return 1;
    }
    if (*(ulong *)((long)pvVar1 + 0xa0) < **(ulong **)((long)pvVar1 + 0x1e0)) {
      iVar2 = __archive_read_consume
                        ((archive_read *)buff_local,
                         **(long **)((long)pvVar1 + 0x1e0) - *(long *)((long)pvVar1 + 0xa0));
      if (iVar2 < 0) {
        return (int)iVar2;
      }
      *(undefined8 *)((long)pvVar1 + 0xa0) = **(undefined8 **)((long)pvVar1 + 0x1e0);
    }
    if (**(ulong **)((long)pvVar1 + 0x1e0) < *(ulong *)((long)pvVar1 + 0xa0)) {
      archive_set_error((archive *)buff_local,-1,"Ignoring out-of-order file (%s) %jd < %jd",
                        *(undefined8 *)((long)pvVar1 + 0x10),**(undefined8 **)((long)pvVar1 + 0x1e0)
                        ,*(undefined8 *)((long)pvVar1 + 0xa0));
      *size_local = 0;
      *offset_local = 0;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0xd0);
      return -0x14;
    }
    *(undefined8 *)((long)pvVar1 + 0xd8) = *(undefined8 *)(*(long *)((long)pvVar1 + 0x1e0) + 8);
  }
  if (*(int *)((long)pvVar1 + 0xe8) == 0) {
    pvVar3 = __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&iso9660);
    *size_local = (size_t)pvVar3;
    if (iso9660 == (iso9660 *)0x0) {
      archive_set_error((archive *)buff_local,-1,"Truncated input file");
    }
    if (*size_local == 0) {
      a_local._4_4_ = -0x1e;
    }
    else {
      if (*(long *)((long)pvVar1 + 0xd8) < (long)iso9660) {
        iso9660 = *(iso9660 **)((long)pvVar1 + 0xd8);
      }
      *offset_local = (int64_t)iso9660;
      *(undefined8 *)bytes_read = *(undefined8 *)((long)pvVar1 + 0xd0);
      *(long *)((long)pvVar1 + 0xd0) = (long)&iso9660->magic + *(long *)((long)pvVar1 + 0xd0);
      *(long *)((long)pvVar1 + 0xd8) = *(long *)((long)pvVar1 + 0xd8) - (long)iso9660;
      *(iso9660 **)((long)pvVar1 + 0xe0) = iso9660;
      *(long *)((long)pvVar1 + 0xa0) = (long)&iso9660->magic + *(long *)((long)pvVar1 + 0xa0);
      a_local._4_4_ = 0;
    }
  }
  else {
    a_local._4_4_ =
         zisofs_read_data((archive_read *)buff_local,(void **)size_local,(size_t *)offset_local,
                          (int64_t *)bytes_read);
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_read_format_iso9660_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}

	if (iso9660->entry_bytes_remaining <= 0) {
		if (iso9660->entry_content != NULL)
			iso9660->entry_content = iso9660->entry_content->next;
		if (iso9660->entry_content == NULL) {
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_EOF);
		}
		/* Seek forward to the start of the entry. */
		if (iso9660->current_position < iso9660->entry_content->offset) {
			int64_t step;

			step = iso9660->entry_content->offset -
			    iso9660->current_position;
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			iso9660->current_position =
			    iso9660->entry_content->offset;
		}
		if (iso9660->entry_content->offset < iso9660->current_position) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file (%s) %jd < %jd",
			    iso9660->pathname.s,
			    (intmax_t)iso9660->entry_content->offset,
			    (intmax_t)iso9660->current_position);
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_WARN);
		}
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;
	}
	if (iso9660->entry_zisofs.pz)
		return (zisofs_read_data(a, buff, size, offset));

	*buff = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read == 0)
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated input file");
	if (*buff == NULL)
		return (ARCHIVE_FATAL);
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	*size = bytes_read;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += bytes_read;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->entry_bytes_unconsumed = bytes_read;
	iso9660->current_position += bytes_read;
	return (ARCHIVE_OK);
}